

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_luma_cdef_strength(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  AV1_COMP *pAVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long *plVar11;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar11 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar11 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar11 + 1;
  }
  puVar2 = (undefined8 *)*plVar11;
  if (puVar2 != (undefined8 *)0x0) {
    pAVar3 = ctx->ppi->cpi;
    uVar4 = *(undefined8 *)(pAVar3->common).cdef_info.cdef_strengths;
    uVar5 = *(undefined8 *)((pAVar3->common).cdef_info.cdef_strengths + 2);
    uVar6 = *(undefined8 *)((pAVar3->common).cdef_info.cdef_strengths + 4);
    uVar7 = *(undefined8 *)((pAVar3->common).cdef_info.cdef_strengths + 6);
    uVar8 = *(undefined8 *)((pAVar3->common).cdef_info.cdef_strengths + 8);
    uVar9 = *(undefined8 *)((pAVar3->common).cdef_info.cdef_strengths + 10);
    uVar10 = *(undefined8 *)((pAVar3->common).cdef_info.cdef_strengths + 0xe);
    puVar2[6] = *(undefined8 *)((pAVar3->common).cdef_info.cdef_strengths + 0xc);
    puVar2[7] = uVar10;
    puVar2[4] = uVar8;
    puVar2[5] = uVar9;
    puVar2[2] = uVar6;
    puVar2[3] = uVar7;
    *puVar2 = uVar4;
    puVar2[1] = uVar5;
    return AOM_CODEC_OK;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_get_luma_cdef_strength(aom_codec_alg_priv_t *ctx,
                                                   va_list args) {
  int *arg = va_arg(args, int *);
  AV1_COMMON const *cm = &ctx->ppi->cpi->common;
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  memcpy(arg, cm->cdef_info.cdef_strengths, CDEF_MAX_STRENGTHS * sizeof(*arg));

  return AOM_CODEC_OK;
}